

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O3

void __thiscall SharedDirectory::cancel_reserved_file(SharedDirectory *this,string *f)

{
  iterator __position;
  Error *this_00;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::find(&(this->pending_files)._M_t,f);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->pending_files)._M_t._M_impl.super__Rb_tree_header) {
    this->remaining_space = this->remaining_space + *(long *)(__position._M_node + 2);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)&this->pending_files,__position);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"File was not reserved");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void SharedDirectory::cancel_reserved_file(const std::string &f) {
  auto it = pending_files.find(f);
  if (it == pending_files.end()) {
    throw Error("File was not reserved");
  }
  remaining_space += it->second;
  pending_files.erase(it);
}